

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

ON_MeshNGonEdge * __thiscall
ON_SimpleArray<ON_MeshNGonEdge>::AppendNew(ON_SimpleArray<ON_MeshNGonEdge> *this)

{
  ON_MeshNGonEdge *pOVar1;
  int iVar2;
  
  iVar2 = this->m_count;
  if (iVar2 == this->m_capacity) {
    iVar2 = NewCapacity(this);
    Reserve(this,(long)iVar2);
    iVar2 = this->m_count;
  }
  pOVar1 = this->m_a;
  pOVar1[iVar2].m_u = (anon_union_8_2_07f07f9a_for_m_u)0x0;
  pOVar1 = pOVar1 + iVar2;
  pOVar1->m_sud_face_id = 0;
  pOVar1->m_mesh_Vi = 0;
  pOVar1->m_mesh_Vj = 0;
  pOVar1->m_u_status = '\0';
  *(undefined3 *)&pOVar1->field_0xd = 0;
  iVar2 = this->m_count;
  this->m_count = iVar2 + 1;
  return this->m_a + iVar2;
}

Assistant:

T& ON_SimpleArray<T>::AppendNew()
{
  if ( m_count == m_capacity ) 
  {
    int new_capacity = NewCapacity();
    Reserve( new_capacity );
  }
  memset( (void*)(&m_a[m_count]), 0, sizeof(T) );
  return m_a[m_count++];
}